

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

bool wasm::Type::
     hasLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
               (unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                *types)

{
  __node_type *p_Var1;
  __node_type *p_Var2;
  bool bVar3;
  _Node_const_iterator<wasm::Type,_true,_true> __tmp_1;
  _Node_iterator_base<wasm::Type,_true> _Var4;
  _Node_const_iterator<wasm::Type,_true,_true> __tmp;
  _Node_iterator_base<wasm::Type,_true> __x;
  bool bVar5;
  
  __x._M_cur = (__node_type *)(types->_M_h)._M_before_begin._M_nxt;
  if (__x._M_cur == (__node_type *)0x0) {
    bVar5 = false;
  }
  else {
    _Var4._M_cur = (__node_type *)
                   std::next<std::__detail::_Node_const_iterator<wasm::Type,true,true>>
                             ((_Node_const_iterator<wasm::Type,_true,_true>)__x._M_cur,1);
    do {
      bVar5 = _Var4._M_cur == (__node_type *)0x0;
      if (bVar5) {
        return bVar5;
      }
      p_Var1 = (__node_type *)((__x._M_cur)->super__Hash_node_base)._M_nxt;
      p_Var2 = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
      bVar3 = hasLeastUpperBound((Type)*(uintptr_t *)
                                        &((__x._M_cur)->super__Hash_node_value<wasm::Type,_true>).
                                         super__Hash_node_value_base<wasm::Type>._M_storage.
                                         _M_storage.__align,
                                 (Type)*(uintptr_t *)
                                        &((_Var4._M_cur)->super__Hash_node_value<wasm::Type,_true>).
                                         super__Hash_node_value_base<wasm::Type>._M_storage.
                                         _M_storage.__align);
      _Var4._M_cur = p_Var2;
      __x._M_cur = p_Var1;
    } while (bVar3);
  }
  return bVar5;
}

Assistant:

static bool hasLeastUpperBound(const T& types) {
    auto first = types.begin(), end = types.end();
    if (first == end) {
      return false;
    }
    for (auto second = std::next(first); second != end;) {
      if (!hasLeastUpperBound(*first++, *second++)) {
        return false;
      }
    }
    return true;
  }